

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O2

ValueInfo * __thiscall ValueInfo::Copy(ValueInfo *this,JitArenaAllocator *allocator)

{
  bool bVar1;
  ValueInfo *pVVar2;
  IntRangeValueInfo *pIVar3;
  IntBoundedValueInfo *pIVar4;
  FloatConstantValueInfo *pFVar5;
  JsTypeValueInfo *pJVar6;
  
  bVar1 = IsIntConstant(this);
  if (bVar1) {
    AsIntConstant(this);
    pVVar2 = (ValueInfo *)
             _IntConstantValueInfo<int,_IntConstantValueInfo,_(ValueStructureKind)1>::Copy
                       ((_IntConstantValueInfo<int,_IntConstantValueInfo,_(ValueStructureKind)1> *)
                        this,allocator);
    return pVVar2;
  }
  bVar1 = IsIntRange(this);
  if (bVar1) {
    AsIntRange(this);
    pIVar3 = IntRangeValueInfo::Copy((IntRangeValueInfo *)this,allocator);
    return &pIVar3->super_ValueInfo;
  }
  bVar1 = IsIntBounded(this);
  if (bVar1) {
    AsIntBounded(this);
    pIVar4 = IntBoundedValueInfo::Copy((IntBoundedValueInfo *)this,allocator);
    return &pIVar4->super_ValueInfo;
  }
  bVar1 = IsFloatConstant(this);
  if (bVar1) {
    AsFloatConstant(this);
    pFVar5 = FloatConstantValueInfo::Copy((FloatConstantValueInfo *)this,allocator);
    return &pFVar5->super_ValueInfo;
  }
  bVar1 = IsJsType(this);
  if (bVar1) {
    AsJsType(this);
    pJVar6 = JsTypeValueInfo::Copy((JsTypeValueInfo *)this,allocator);
    return &pJVar6->super_ValueInfo;
  }
  bVar1 = IsArrayValueInfo(this);
  if (bVar1) {
    AsArrayValueInfo(this);
    pVVar2 = ArrayValueInfo::Copy((ArrayValueInfo *)this,allocator,true,true,true);
    return pVVar2;
  }
  pVVar2 = CopyWithGenericStructureKind(this,allocator);
  return pVVar2;
}

Assistant:

ValueInfo *
ValueInfo::Copy(JitArenaAllocator * allocator)
{
    if (IsIntConstant())
    {
        return AsIntConstant()->Copy(allocator);
    }
    if (IsIntRange())
    {
        return AsIntRange()->Copy(allocator);
    }
    if (IsIntBounded())
    {
        return AsIntBounded()->Copy(allocator);
    }
    if (IsFloatConstant())
    {
        return AsFloatConstant()->Copy(allocator);
    }
    if (IsJsType())
    {
        return AsJsType()->Copy(allocator);
    }
    if (IsArrayValueInfo())
    {
        return AsArrayValueInfo()->Copy(allocator);
    }
    return CopyWithGenericStructureKind(allocator);
}